

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

void dasm_put(BuildCtx *ctx,int start,...)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  dasm_State *pdVar5;
  dasm_ActList puVar6;
  dasm_Section *pdVar7;
  ulong uVar8;
  char in_AL;
  ulong uVar9;
  int *piVar10;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar14;
  int *piVar15;
  void **ppvVar16;
  uint *puVar17;
  byte *pbVar18;
  byte *pbVar19;
  int iVar20;
  int iVar21;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  pdVar5 = ctx->D;
  puVar6 = pdVar5->actionlist;
  pdVar7 = pdVar5->section;
  uVar14 = pdVar7->pos;
  iVar12 = pdVar7->ofs;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((int)uVar14 < pdVar7->epos) {
    piVar10 = pdVar7->rbuf;
  }
  else {
    uVar11 = pdVar7->bsize;
    uVar9 = uVar11 + 200;
    if (uVar11 < 0xffffffffffffff38) {
      uVar8 = 0x10;
      if (0x10 < uVar11) {
        uVar8 = uVar11;
      }
      do {
        uVar11 = uVar8;
        uVar8 = uVar11 * 2;
      } while (uVar11 < uVar9);
      piVar10 = (int *)realloc(pdVar7->buf,uVar11);
      pdVar7->buf = piVar10;
      if (piVar10 == (int *)0x0) {
        exit(1);
      }
      pdVar7->bsize = uVar11;
    }
    else {
      piVar10 = pdVar7->buf;
    }
    piVar10 = piVar10 + -(ulong)(uVar14 & 0xff000000);
    pdVar7->rbuf = piVar10;
    pdVar7->epos = (int)((ulong)(long)(int)uVar11 >> 2) + (uVar14 & 0xff000000) + -0x19;
  }
  piVar10[(int)uVar14] = start;
  local_100 = &ap[0].overflow_arg_area;
  uVar13 = 0x10;
  pbVar18 = puVar6 + start;
  iVar20 = uVar14 + 1;
LAB_00105b2d:
  while( true ) {
    pbVar19 = pbVar18 + 1;
    bVar2 = *pbVar18;
    if (0xe8 < bVar2) break;
    iVar12 = iVar12 + 1;
    pbVar18 = pbVar19;
  }
  switch(bVar2) {
  case 0xf4:
  case 0xf6:
    bVar3 = pbVar18[1];
    pbVar19 = pbVar18 + 2;
    piVar15 = (int *)((ulong)((uint)bVar3 * 4) + (long)pdVar5->lglabels);
    if (bVar3 < 0xf7) {
      if (((bVar3 < 10) && (-1 < *piVar15)) || (pdVar5->lgsize <= (ulong)bVar3 << 2))
      goto LAB_00105ef8;
      goto LAB_00105cbd;
    }
    piVar1 = piVar15 + -0xf6;
    piVar15 = piVar15 + -0xf6;
    iVar21 = *piVar1;
    if (*piVar1 < 1) {
      iVar21 = 0;
    }
LAB_00105cc5:
    piVar10[iVar20] = iVar21;
    *piVar15 = iVar20;
    break;
  case 0xf5:
  case 0xf7:
    uVar11 = (ulong)uVar13;
    if (uVar11 < 0x29) {
      uVar13 = uVar13 + 8;
      ppvVar16 = (void **)((long)local_e8 + uVar11);
    }
    else {
      ppvVar16 = local_100;
      local_100 = local_100 + 1;
    }
    if (pdVar5->pcsize <= (ulong)((long)*(int *)ppvVar16 * 4)) {
LAB_00105ee6:
      uVar14 = (int)pbVar19 + ~*(uint *)&pdVar5->actionlist | 0x14000000;
      goto LAB_00105f54;
    }
    piVar15 = pdVar5->pclabels + *(int *)ppvVar16;
LAB_00105cbd:
    iVar21 = *piVar15;
    if (-1 < iVar21) goto LAB_00105cc5;
    piVar10[iVar20] = -iVar21;
    break;
  case 0xf8:
    pbVar19 = pbVar18 + 2;
    if (pdVar5->lgsize <= (ulong)pbVar18[1] * 4) {
LAB_00105ef8:
      pdVar5->status = (int)pbVar18 + 2 + ~*(uint *)&pdVar5->actionlist | 0x13000000;
      return;
    }
    puVar17 = (uint *)(pdVar5->lglabels + pbVar18[1]);
    goto LAB_00105e74;
  case 0xf9:
    uVar11 = (ulong)uVar13;
    if (uVar11 < 0x29) {
      uVar13 = uVar13 + 8;
      ppvVar16 = (void **)((long)local_e8 + uVar11);
    }
    else {
      ppvVar16 = local_100;
      local_100 = local_100 + 1;
    }
    if (pdVar5->pcsize <= (ulong)((long)*(int *)ppvVar16 * 4)) goto LAB_00105ee6;
    puVar17 = (uint *)(pdVar5->pclabels + *(int *)ppvVar16);
LAB_00105e74:
    uVar14 = *puVar17;
    while (0 < (int)uVar14) {
      piVar15 = pdVar5->sections[uVar14 >> 0x18].rbuf;
      uVar4 = piVar15[uVar14];
      piVar15[uVar14] = iVar20;
      uVar14 = uVar4;
    }
    *puVar17 = -iVar20;
LAB_00105e9e:
    piVar10[iVar20] = iVar12;
    pbVar18 = pbVar19;
    iVar20 = iVar20 + 1;
    goto LAB_00105b2d;
  case 0xfa:
    pbVar19 = pbVar18 + 2;
    iVar12 = iVar12 + (uint)pbVar18[1];
    goto LAB_00105e9e;
  case 0xfb:
    iVar12 = iVar12 + 4;
    pbVar18 = pbVar18 + 3;
    goto LAB_00105b2d;
  case 0xfc:
    iVar12 = iVar12 + 1;
    pbVar18 = pbVar18 + 2;
    goto LAB_00105b2d;
  case 0xfd:
    goto switchD_00105b93_caseD_fd;
  case 0xfe:
    if ((int)(uint)*pbVar19 < pdVar5->maxsection) {
      pdVar5->section = pdVar5->sections + *pbVar19;
switchD_00105b93_caseD_ff:
      pdVar7->pos = iVar20;
      pdVar7->ofs = iVar12;
    }
    else {
      uVar14 = (int)pbVar19 + ~*(uint *)&pdVar5->actionlist | 0x12000000;
LAB_00105f54:
      pdVar5->status = uVar14;
    }
    return;
  case 0xff:
    goto switchD_00105b93_caseD_ff;
  default:
    if ((ulong)uVar13 < 0x29) {
      piVar10[iVar20] = *(int *)((long)local_e8 + (ulong)uVar13);
      (*(code *)(&DAT_0010c040 + *(int *)(&DAT_0010c040 + (ulong)(bVar2 - 0xe9) * 4)))();
      return;
    }
    piVar10[iVar20] = *(int *)local_100;
    (*(code *)(&DAT_0010c040 + *(int *)(&DAT_0010c040 + (ulong)(bVar2 - 0xe9) * 4)))
              (&switchD_00105b93::switchdataD_0010c010,&DAT_0010c06c);
    return;
  }
  pbVar18 = pbVar19;
  if ((bVar2 & 0xfe) == 0xf4) {
    iVar12 = iVar12 + 4;
    piVar10[iVar20 + 1] = iVar12;
    iVar20 = iVar20 + 2;
  }
  else {
    iVar12 = iVar12 + 8;
    iVar20 = iVar20 + 1;
  }
  goto LAB_00105b2d;
switchD_00105b93_caseD_fd:
  pbVar18 = pbVar19;
  goto LAB_00105b2d;
}

Assistant:

void dasm_put(Dst_DECL, int start, ...)
{
  va_list ap;
  dasm_State *D = Dst_REF;
  dasm_ActList p = D->actionlist + start;
  dasm_Section *sec = D->section;
  int pos = sec->pos, ofs = sec->ofs, mrm = -1;
  int *b;

  if (pos >= sec->epos) {
    DASM_M_GROW(Dst, int, sec->buf, sec->bsize,
      sec->bsize + 2*DASM_MAXSECPOS*sizeof(int));
    sec->rbuf = sec->buf - DASM_POS2BIAS(pos);
    sec->epos = (int)sec->bsize/sizeof(int) - DASM_MAXSECPOS+DASM_POS2BIAS(pos);
  }

  b = sec->rbuf;
  b[pos++] = start;

  va_start(ap, start);
  while (1) {
    int action = *p++;
    if (action < DASM_DISP) {
      ofs++;
    } else if (action <= DASM_REL_A) {
      int n = va_arg(ap, int);
      b[pos++] = n;
      switch (action) {
      case DASM_DISP:
	if (n == 0) { if (mrm < 0) mrm = p[-2]; if ((mrm&7) != 5) break; }
	/* fallthrough */
      case DASM_IMM_DB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_REL_A: /* Assumes ptrdiff_t is int. !x64 */
      case DASM_IMM_D: ofs += 4; break;
      case DASM_IMM_S: CK(((n+128)&-256) == 0, RANGE_I); goto ob;
      case DASM_IMM_B: CK((n&-256) == 0, RANGE_I); ob: ofs++; break;
      case DASM_IMM_WB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_IMM_W: CK((n&-65536) == 0, RANGE_I); ofs += 2; break;
      case DASM_SPACE: p++; ofs += n; break;
      case DASM_SETLABEL: b[pos-2] = -0x40000000; break;  /* Neg. label ofs. */
      case DASM_VREG: CK((n&-16) == 0 && (n != 4 || (*p>>5) != 2), RANGE_VREG);
	if (*p < 0x40 && p[1] == DASM_DISP) mrm = n;
	if (*p < 0x20 && (n&7) == 4) ofs++;
	switch ((*p++ >> 3) & 3) {
	case 3: n |= b[pos-3]; /* fallthrough */
	case 2: n |= b[pos-2]; /* fallthrough */
	case 1: if (n <= 7) { b[pos-1] |= 0x10; ofs--; }
	}
	continue;
      }
      mrm = -1;
    } else {
      int *pl, n;
      switch (action) {
      case DASM_REL_LG:
      case DASM_IMM_LG:
	n = *p++; pl = D->lglabels + n;
	/* Bkwd rel or global. */
	if (n <= 246) { CK(n>=10||*pl<0, RANGE_LG); CKPL(lg, LG); goto putrel; }
	pl -= 246; n = *pl;
	if (n < 0) n = 0;  /* Start new chain for fwd rel if label exists. */
	goto linkrel;
      case DASM_REL_PC:
      case DASM_IMM_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putrel:
	n = *pl;
	if (n < 0) {  /* Label exists. Get label pos and store it. */
	  b[pos] = -n;
	} else {
      linkrel:
	  b[pos] = n;  /* Else link to rel chain, anchored at label. */
	  *pl = pos;
	}
	pos++;
	ofs += 4;  /* Maximum offset needed. */
	if (action == DASM_REL_LG || action == DASM_REL_PC) {
	  b[pos++] = ofs;  /* Store pass1 offset estimate. */
	} else if (sizeof(ptrdiff_t) == 8) {
	  ofs += 4;
	}
	break;
      case DASM_LABEL_LG: pl = D->lglabels + *p++; CKPL(lg, LG); goto putlabel;
      case DASM_LABEL_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putlabel:
	n = *pl;  /* n > 0: Collapse rel chain and replace with label pos. */
	while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = pos; }
	*pl = -pos;  /* Label exists now. */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_ALIGN:
	ofs += *p++;  /* Maximum alignment needed (arg is 2**n-1). */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_EXTERN: p += 2; ofs += 4; break;
      case DASM_ESC: p++; ofs++; break;
      case DASM_MARK: mrm = p[-2]; break;
      case DASM_SECTION:
	n = *p; CK(n < D->maxsection, RANGE_SEC); D->section = &D->sections[n];
      case DASM_STOP: goto stop;
      }
    }
  }
stop:
  va_end(ap);
  sec->pos = pos;
  sec->ofs = ofs;
}